

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

void __thiscall Json::StyledWriter::writeCommentAfterValueOnSameLine(StyledWriter *this,Value *root)

{
  bool bVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  string local_58;
  string local_38;
  
  bVar1 = Value::hasComment(root,commentAfterOnSameLine);
  if (bVar1) {
    Value::getComment_abi_cxx11_(&local_38,root,commentAfterOnSameLine);
    normalizeEOL(&local_58,&local_38);
    std::operator+(&bStack_78," ",&local_58);
    std::__cxx11::string::append((string *)&this->document_);
    std::__cxx11::string::~string((string *)&bStack_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Value::hasComment(root,commentAfter);
  if (bVar1) {
    psVar2 = &this->document_;
    std::__cxx11::string::append((char *)psVar2);
    Value::getComment_abi_cxx11_(&local_58,root,commentAfter);
    normalizeEOL(&bStack_78,&local_58);
    std::__cxx11::string::append((string *)psVar2);
    std::__cxx11::string::~string((string *)&bStack_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::append((char *)psVar2);
  }
  return;
}

Assistant:

void 
StyledWriter::writeCommentAfterValueOnSameLine( const Value &root )
{
   if ( root.hasComment( commentAfterOnSameLine ) )
      document_ += " " + normalizeEOL( root.getComment( commentAfterOnSameLine ) );

   if ( root.hasComment( commentAfter ) )
   {
      document_ += "\n";
      document_ += normalizeEOL( root.getComment( commentAfter ) );
      document_ += "\n";
   }
}